

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O2

int aes128gcm_decrypt(ptls_aead_context_t *_ctx,void *output,size_t *outlen,void *input,size_t inlen
                     ,void *iv,uint8_t unused)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0x14;
  if (0xf < inlen) {
    iVar1 = cf_gcm_decrypt(&cf_aes,_ctx + 1,(uint8_t *)input,inlen - 0x10,(uint8_t *)0x0,0,
                           (uint8_t *)iv,0xc,(uint8_t *)((long)input + (inlen - 0x10)),0x10,
                           (uint8_t *)output);
    if (iVar1 == 0) {
      *outlen = inlen - 0x10;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int aes128gcm_decrypt(ptls_aead_context_t *_ctx, void *output, size_t *outlen, const void *input, size_t inlen,
                             const void *iv, uint8_t unused)
{
    struct aes128gcm_context_t *ctx = (struct aes128gcm_context_t *)_ctx;

    if (inlen < AES128GCM_TAG_SIZE)
        return PTLS_ALERT_BAD_RECORD_MAC;
    size_t tag_offset = inlen - AES128GCM_TAG_SIZE;

    if (cf_gcm_decrypt(&cf_aes, &ctx->ctx, input, tag_offset, NULL, 0, iv, AES128GCM_IV_SIZE, (uint8_t *)input + tag_offset,
                       AES128GCM_TAG_SIZE, output) != 0)
        return PTLS_ALERT_BAD_RECORD_MAC;

    *outlen = tag_offset;
    return 0;
}